

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.h
# Opt level: O0

S2Point * __thiscall S2Loop::vertex(S2Loop *this,int i)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  int local_98;
  int j;
  S2LogMessageVoidify local_3d [20];
  byte local_29;
  S2LogMessage local_28;
  S2LogMessageVoidify local_15;
  int local_14;
  S2Loop *pSStack_10;
  int i_local;
  S2Loop *this_local;
  
  local_29 = 0;
  local_14 = i;
  pSStack_10 = this;
  if (i < 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop.h"
               ,0xb1,kFatal,(ostream *)&std::cerr);
    local_29 = 1;
    poVar3 = S2LogMessage::stream(&local_28);
    poVar3 = std::operator<<(poVar3,"Check failed: (i) >= (0) ");
    S2LogMessageVoidify::operator&(&local_15,poVar3);
  }
  iVar2 = local_14;
  if ((local_29 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_28);
  }
  iVar1 = num_vertices(this);
  local_98 = local_14;
  if (SBORROW4(iVar2,iVar1 * 2) == iVar2 + iVar1 * -2 < 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&j,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop.h"
               ,0xb2,kFatal,(ostream *)&std::cerr);
    poVar3 = S2LogMessage::stream((S2LogMessage *)&j);
    poVar3 = std::operator<<(poVar3,"Check failed: (i) < (2 * num_vertices()) ");
    S2LogMessageVoidify::operator&(local_3d,poVar3);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&j);
  }
  iVar2 = num_vertices(this);
  local_98 = local_98 - iVar2;
  if (local_98 < 0) {
    local_98 = local_14;
  }
  return this->vertices_ + local_98;
}

Assistant:

const S2Point& vertex(int i) const {
    S2_DCHECK_GE(i, 0);
    S2_DCHECK_LT(i, 2 * num_vertices());
    int j = i - num_vertices();
    return vertices_[j < 0 ? i : j];
  }